

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objShiftPtrs(void *obj,ptrdiff_t diff)

{
  void *in_RSI;
  long *in_RDI;
  size_t i;
  ulong diff_00;
  
  for (diff_00 = 0; diff_00 < (ulong)in_RDI[2]; diff_00 = diff_00 + 1) {
    if ((in_RDI <= (long *)(in_RDI[diff_00 + 3] + (long)in_RSI)) &&
       ((ulong)(in_RDI[diff_00 + 3] + (long)in_RSI) < (ulong)((long)in_RDI + *in_RDI))) {
      objShiftPtrs(in_RSI,diff_00);
      in_RDI[diff_00 + 3] = (long)in_RSI + in_RDI[diff_00 + 3];
    }
  }
  for (; diff_00 < (ulong)in_RDI[1]; diff_00 = diff_00 + 1) {
    if ((in_RDI <= (long *)(in_RDI[diff_00 + 3] + (long)in_RSI)) &&
       ((ulong)(in_RDI[diff_00 + 3] + (long)in_RSI) < (ulong)((long)in_RDI + *in_RDI))) {
      in_RDI[diff_00 + 3] = (long)in_RSI + in_RDI[diff_00 + 3];
    }
  }
  return;
}

Assistant:

static void objShiftPtrs(void* obj, ptrdiff_t diff)
{
	size_t i;
	// просмотреть объекты
	for (i = 0; i < objOCount(obj); ++i)
		// вложенный объект?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
		{
			objShiftPtrs(objPtr(obj, i, void), diff);
			objPtr(obj, i, octet) += diff;
		}
	// просмотреть оставшиеся указатели
	for (; i < objPCount(obj); ++i)
		// вложенный указатель?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
			objPtr(obj, i, octet) += diff;
}